

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O3

int ffcalc_rng(fitsfile *infptr,char *expr,fitsfile *outfptr,char *parName,char *parInfo,int nRngs,
              long *start,long *end,int *status)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ushort **ppuVar6;
  size_t sVar7;
  long lVar8;
  char *err_message;
  ulong uVar9;
  anon_union_256_9_9da4f342_for_data *comm;
  LONGLONG value;
  fitsfile *pfVar10;
  ulong uVar11;
  int colNo;
  char tform [16];
  int naxis;
  uint local_274;
  ulong local_270;
  fitsfile *local_268;
  long nelem;
  char nullKwd [9];
  long totaln;
  int typecode;
  long width;
  long repeat;
  long naxes [5];
  parseInfo Info;
  ParseData lParse;
  char card [81];
  
  if (*status != 0) {
    return *status;
  }
  local_274 = nRngs;
  local_268 = outfptr;
  memset(&Info,0,0x90);
  iVar4 = ffiprs(infptr,0,expr,5,&Info.datatype,&nelem,&naxis,naxes,&lParse,status);
  lVar8 = nelem;
  if (iVar4 != 0) goto LAB_0013097b;
  if (nelem < 0) {
    nelem = -nelem;
  }
  colNo = 0;
  local_270 = nelem;
  Info.parseData = &lParse;
  ffpmrk();
  pfVar10 = local_268;
  ffgcno(local_268,0,parName,&colNo,status);
  ffcmsg();
  if (*status == 0) {
    ffkeyn("TDIM",colNo,tform,status);
    ffgcrd(pfVar10,tform,card,status);
    iVar4 = *status;
    if (iVar4 == 0xca) {
      *status = 0;
      ffcmsg();
      if (1 < naxis) goto LAB_00130bb8;
LAB_00130bcb:
      iVar4 = *status;
    }
    else if (iVar4 == 0) {
LAB_00130bb8:
      ffptdm(pfVar10,colNo,naxis,naxes,status);
      goto LAB_00130bcb;
    }
    if (iVar4 != 0) goto LAB_0013097b;
    bVar2 = true;
  }
  else {
    *status = 0;
    if (*parName == '#') {
      if (-1 < lVar8) {
        ffcprs(&lParse);
        err_message = "Cannot put tabular result into keyword (ffcalc)";
LAB_00130c2c:
        ffpmsg(err_message);
        *status = 0x1b0;
        return 0x1b0;
      }
      parName = parName + 1;
      iVar4 = fits_strcasecmp(parName,"HISTORY");
      if (((iVar4 == 0) || (iVar4 = fits_strcasecmp(parName,"COMMENT"), iVar4 == 0)) &&
         (Info.datatype != 0x10)) {
        ffcprs(&lParse);
        err_message = "HISTORY and COMMENT values must be strings (ffcalc)";
        goto LAB_00130c2c;
      }
LAB_00130c8f:
      bVar2 = true;
      if (-1 < colNo) goto LAB_00130ed5;
    }
    else {
      if ((lVar8 < 0) && (iVar4 = ffgcrd(pfVar10,parName,card,status), iVar4 != 0xca)) {
        if (*status != 0) goto LAB_0013097b;
        goto LAB_00130c8f;
      }
      colNo = -1;
    }
    *status = 0;
    ffgncl(pfVar10,&colNo,status);
    colNo = colNo + 1;
    if (parInfo == (char *)0x0) {
LAB_00130b28:
      if (lParse.hdutype == 2) {
        parInfo = tform;
        snprintf(parInfo,0xf,"%ld",local_270);
        if (Info.datatype < 0x29) {
          if (Info.datatype == 1) {
            parInfo = tform;
            sVar7 = strlen(parInfo);
            (tform + sVar7)[0] = 'X';
            (tform + sVar7)[1] = '\0';
          }
          else if (Info.datatype == 0xe) {
            parInfo = tform;
            sVar7 = strlen(parInfo);
            (tform + sVar7)[0] = 'L';
            (tform + sVar7)[1] = '\0';
          }
          else if (Info.datatype == 0x10) {
            parInfo = tform;
            sVar7 = strlen(parInfo);
            (tform + sVar7)[0] = 'A';
            (tform + sVar7)[1] = '\0';
          }
        }
        else if (Info.datatype == 0x29) {
          parInfo = tform;
          sVar7 = strlen(parInfo);
          (tform + sVar7)[0] = 'J';
          (tform + sVar7)[1] = '\0';
        }
        else if (Info.datatype == 0x51) {
          parInfo = tform;
          sVar7 = strlen(parInfo);
          (tform + sVar7)[0] = 'K';
          (tform + sVar7)[1] = '\0';
        }
        else if (Info.datatype == 0x52) {
          parInfo = tform;
          sVar7 = strlen(parInfo);
          (tform + sVar7)[0] = 'D';
          (tform + sVar7)[1] = '\0';
        }
      }
      else {
        parInfo = tform;
        if (Info.datatype < 0x10) {
          if (Info.datatype == 1) goto LAB_00130d14;
          if (Info.datatype == 0xe) {
            ffcprs(&lParse);
            ffpmsg("Cannot create LOGICAL column in ASCII table");
            *status = 0xe3;
            return 0xe3;
          }
        }
        else {
          if (Info.datatype == 0x10) {
LAB_00130d14:
            snprintf(tform,0x10,"A%ld",local_270);
            goto LAB_00130d67;
          }
          if (Info.datatype == 0x29) {
            builtin_strncpy(tform,"I11",4);
          }
          else if (Info.datatype == 0x52) {
            builtin_strncpy(tform,"D23.15",7);
          }
        }
      }
    }
    else {
      cVar1 = *parInfo;
      if ((long)cVar1 == 0) goto LAB_00130b28;
      ppuVar6 = __ctype_b_loc();
      if (((*(byte *)((long)*ppuVar6 + (long)cVar1 * 2 + 1) & 8) != 0) || (lParse.hdutype != 2))
      goto LAB_00130d6a;
      uVar9 = local_270;
      if ((cVar1 == 'B') && (Info.datatype == 1)) {
        nelem = local_270 + 7 >> 3;
        uVar9 = nelem;
      }
      snprintf(tform,0x10,"%ld%s",uVar9);
LAB_00130d67:
      parInfo = tform;
    }
LAB_00130d6a:
    fficol(pfVar10,colNo,parName,parInfo,status);
    if (1 < naxis) {
      ffptdm(pfVar10,colNo,naxis,naxes,status);
    }
    ffkeyn("TNULL",colNo,nullKwd,status);
    iVar4 = ffgcrd(pfVar10,nullKwd,card,status);
    bVar2 = true;
    if (iVar4 == 0xca) {
      *status = 0;
      if (lParse.hdutype == 1) {
        ffpkys(pfVar10,nullKwd,"NULL","Null value string",status);
        ffsnul(pfVar10,colNo,"NULL",status);
        bVar2 = false;
      }
      else if (lParse.hdutype == 2) {
        ffbnfm(parInfo,&typecode,&repeat,&width,status);
        if (typecode < 0x1f) {
          value = 0xff;
          if (typecode != 0xb) {
            if (typecode != 0x15) goto LAB_001311cd;
            value = -0x8000;
          }
        }
        else if ((typecode == 0x1f) || (typecode == 0x29)) {
          value = -0x80000000;
        }
        else {
          if (typecode != 0x51) {
LAB_001311cd:
            bVar2 = true;
            goto LAB_00130ed5;
          }
          value = -0x8000000000000000;
        }
        ffpkyj(pfVar10,nullKwd,value,"Null value",status);
        fftnul(pfVar10,colNo,value,status);
        bVar2 = false;
      }
    }
  }
LAB_00130ed5:
  if (colNo < 1) {
    if (Info.datatype < 0x10) {
      if (Info.datatype != 1) {
        if (Info.datatype == 0xe) {
          ffukyl(pfVar10,parName,(int)lParse.Nodes[lParse.resultNode].value.data.log,parInfo,status)
          ;
        }
        goto LAB_0013097b;
      }
    }
    else if (Info.datatype != 0x10) {
      if (Info.datatype == 0x29) {
        ffukyj(pfVar10,parName,lParse.Nodes[lParse.resultNode].value.data.lng,parInfo,status);
      }
      else if (Info.datatype == 0x52) {
        ffukyd(pfVar10,parName,lParse.Nodes[lParse.resultNode].value.data.dbl,0xf,parInfo,status);
      }
      goto LAB_0013097b;
    }
    iVar4 = fits_strcasecmp(parName,"HISTORY");
    if (iVar4 == 0) {
      ffphis(pfVar10,&lParse.Nodes[lParse.resultNode].value.data.log,status);
    }
    else {
      iVar4 = fits_strcasecmp(parName,"COMMENT");
      comm = &lParse.Nodes[lParse.resultNode].value.data;
      if (iVar4 == 0) {
        ffpcom(pfVar10,&comm->log,status);
      }
      else {
        ffukys(pfVar10,parName,&comm->log,parInfo,status);
      }
    }
  }
  else {
    ffgkyj(infptr,"NAXIS2",&totaln,(char *)0x0,status);
    iVar4 = lParse.nCols;
    iVar5 = fits_parser_allocateCol(&lParse,lParse.nCols,status);
    pfVar10 = local_268;
    if (iVar5 == 0) {
      bVar3 = false;
      fits_iter_set_by_num(lParse.colData + iVar4,local_268,colNo,0,2);
      lParse.nCols = lParse.nCols + 1;
      if (0 < (int)local_274) {
        uVar11 = (ulong)local_274;
        uVar9 = 0;
        do {
          Info.dataPtr = (void *)0x0;
          lVar8 = end[uVar9] - start[uVar9];
          Info.maxRows = lVar8 + 1;
          if ((((local_274 == 1) && (8 < lVar8)) && (*start == 1)) && (*end == totaln)) {
            lVar8 = 0;
          }
          else {
            lVar8 = (long)(int)Info.maxRows;
          }
          iVar4 = ffiter(lParse.nCols,lParse.colData,start[uVar9] + -1,lVar8,fits_parser_workfn,
                         &Info,status);
          if (iVar4 == -1) {
            *status = 0;
          }
          else if (*status != 0) goto LAB_0013097b;
          if (Info.anyNull != 0) {
            bVar3 = true;
          }
          uVar9 = uVar9 + 1;
          pfVar10 = local_268;
        } while (uVar11 != uVar9);
      }
      if (!bVar2 && !bVar3) {
        ffdkey(pfVar10,nullKwd,status);
      }
    }
  }
LAB_0013097b:
  ffcprs(&lParse);
  return *status;
}

Assistant:

int ffcalc_rng( fitsfile *infptr,   /* I - Input FITS file                  */
                char     *expr,     /* I - Arithmetic expression            */
                fitsfile *outfptr,  /* I - Output fits file                 */
                char     *parName,  /* I - Name of output parameter         */
                char     *parInfo,  /* I - Extra information on parameter   */
                int      nRngs,     /* I - Row range info                   */
                long     *start,    /* I - Row range info                   */
                long     *end,      /* I - Row range info                   */
                int      *status )  /* O - Error status                     */
/*                                                                          */
/* Evaluate an expression using the data in the input FITS file and place   */
/* the results into either a column or keyword in the output fits file,     */
/* depending on the value of parName (keywords normally prefixed with '#')  */
/* and whether the expression evaluates to a constant or a table column.    */
/* The logic is as follows:                                                 */
/*    (1) If a column exists with name, parName, put results there.         */
/*    (2) If parName starts with '#', as in #NAXIS, put result there,       */
/*        with parInfo used as the comment. If expression does not evaluate */
/*        to a constant, flag an error.                                     */
/*    (3) If a keyword exists with name, parName, and expression is a       */
/*        constant, put result there, using parInfo as the new comment.     */
/*    (4) Else, create a new column with name parName and TFORM parInfo.    */
/*        If parInfo is NULL, use a default data type for the column.       */
/*--------------------------------------------------------------------------*/
{
   parseInfo Info;
   int naxis, constant, typecode, newNullKwd=0;
   long nelem, naxes[MAXDIMS], repeat, width;
   int col_cnt, colNo;
   Node *result;
   char card[81], tform[16], nullKwd[9], tdimKwd[9];
   ParseData lParse;

   if( *status ) return( *status );

   memset(&Info, 0, sizeof(Info));   

   if( ffiprs( infptr, 0, expr, MAXDIMS, &Info.datatype, &nelem, &naxis,
               naxes, &lParse, status ) ) {

      ffcprs(&lParse);
      return( *status );
   }
   if( nelem<0 ) {
      constant = 1;
      nelem = -nelem;
   } else
      constant = 0;

   Info.parseData = &lParse;
   /*  Case (1): If column exists put it there  */

   colNo = 0;
   ffpmrk(); /* prevent lack of column name from sullying the stack */
   ffgcno( outfptr, CASEINSEN, parName, &colNo, status );
   ffcmsg();   
   if( *status ) {

      /*  Output column doesn't exist.  Test for keyword. */

      /* Case (2): Does parName indicate result should be put into keyword */

      *status = 0;
      if( parName[0]=='#' ) {
         if( ! constant ) {
            ffcprs(&lParse);
            ffpmsg( "Cannot put tabular result into keyword (ffcalc)" );
            return( *status = PARSE_BAD_TYPE );
         }
         parName++;  /* Advance past '#' */
	 if ( (fits_strcasecmp(parName,"HISTORY") == 0 || fits_strcasecmp(parName,"COMMENT") == 0) &&
	      Info.datatype != TSTRING ) {
            ffcprs(&lParse);
            ffpmsg( "HISTORY and COMMENT values must be strings (ffcalc)" );
	    return( *status = PARSE_BAD_TYPE );
	 }

      } else if( constant ) {

         /* Case (3): Does a keyword named parName already exist */

         if( ffgcrd( outfptr, parName, card, status )==KEY_NO_EXIST ) {
            colNo = -1;
         } else if( *status ) {
            ffcprs(&lParse);
            return( *status );
         }

      } else
         colNo = -1;

      if( colNo<0 ) {

         /* Case (4): Create new column */

         *status = 0;
         ffgncl( outfptr, &colNo, status );
         colNo++;
         if( parInfo==NULL || *parInfo=='\0' ) {
            /*  Figure out best default column type  */
            if( lParse.hdutype==BINARY_TBL ) {
               snprintf(tform,15,"%ld",nelem);
               switch( Info.datatype ) {
               case TLOGICAL:  strcat(tform,"L");  break;
               case TLONG:     strcat(tform,"J");  break;
               case TDOUBLE:   strcat(tform,"D");  break;
               case TSTRING:   strcat(tform,"A");  break;
               case TBIT:      strcat(tform,"X");  break;
               case TLONGLONG: strcat(tform,"K");  break;
               }
            } else {
               switch( Info.datatype ) {
               case TLOGICAL:
                  ffcprs(&lParse);
                  ffpmsg("Cannot create LOGICAL column in ASCII table");
                  return( *status = NOT_BTABLE );
               case TLONG:     strcpy(tform,"I11");     break;
               case TDOUBLE:   strcpy(tform,"D23.15");  break;
               case TSTRING:   
               case TBIT:      snprintf(tform,16,"A%ld",nelem);  break;
               }
            }
            parInfo = tform;
         } else if( !(isdigit((int) *parInfo)) && lParse.hdutype==BINARY_TBL ) {
            if( Info.datatype==TBIT && *parInfo=='B' )
               nelem = (nelem+7)/8;
            snprintf(tform,16,"%ld%s",nelem,parInfo);
            parInfo = tform;
         }
         fficol( outfptr, colNo, parName, parInfo, status );
         if( naxis>1 )
            ffptdm( outfptr, colNo, naxis, naxes, status );

         /*  Setup TNULLn keyword in case NULLs are encountered  */

         ffkeyn("TNULL", colNo, nullKwd, status);
         if( ffgcrd( outfptr, nullKwd, card, status )==KEY_NO_EXIST ) {
            *status = 0;
            if( lParse.hdutype==BINARY_TBL ) {
	       LONGLONG nullVal=0;
               fits_binary_tform( parInfo, &typecode, &repeat, &width, status );
               if( typecode==TBYTE )
                  nullVal = UCHAR_MAX;
               else if( typecode==TSHORT )
                  nullVal = SHRT_MIN;
               else if( typecode==TINT )
                  nullVal = INT_MIN;
               else if( typecode==TLONG ) {
                  if (sizeof(long) == 8 && sizeof(int) == 4)
                     nullVal = INT_MIN;
                  else
                     nullVal = LONG_MIN;
               }
               else if( typecode==TLONGLONG )
                  nullVal = LONGLONG_MIN;
		  
               if( nullVal ) {
                  ffpkyj( outfptr, nullKwd, nullVal, "Null value", status );
                  fits_set_btblnull( outfptr, colNo, nullVal, status );
                  newNullKwd = 1;
               }
            } else if( lParse.hdutype==ASCII_TBL ) {
               ffpkys( outfptr, nullKwd, "NULL", "Null value string", status );
               fits_set_atblnull( outfptr, colNo, "NULL", status );
               newNullKwd = 1;
            }
         }

      }

   } else if( *status ) {
      ffcprs(&lParse);
      return( *status );
   } else {

      /********************************************************/
      /*  Check if a TDIM keyword should be written/updated.  */
      /********************************************************/

      ffkeyn("TDIM", colNo, tdimKwd, status);
      ffgcrd( outfptr, tdimKwd, card, status );
      if( *status==0 ) {
         /*  TDIM exists, so update it with result's dimension  */
         ffptdm( outfptr, colNo, naxis, naxes, status );
      } else if( *status==KEY_NO_EXIST ) {
         /*  TDIM does not exist, so clear error stack and     */
         /*  write a TDIM only if result is multi-dimensional  */
         *status = 0;
         ffcmsg();
         if( naxis>1 )
            ffptdm( outfptr, colNo, naxis, naxes, status );
      }
      if( *status ) {
         /*  Either some other error happened in ffgcrd   */
         /*  or one happened in ffptdm                    */
         ffcprs(&lParse);
         return( *status );
      }

   }

   if( colNo>0 ) {

      /*  Output column exists (now)... put results into it  */

      int anyNull = 0;
      int nPerLp, i;
      long totaln;

      ffgkyj(infptr, "NAXIS2", &totaln, 0, status);

      /*************************************/
      /* Create new iterator Output Column */
      /*************************************/

      col_cnt = lParse.nCols;
      if( fits_parser_allocateCol( &lParse, col_cnt, status ) ) {
         ffcprs(&lParse);
         return( *status );
      }

      fits_iter_set_by_num( lParse.colData+col_cnt, outfptr,
                            colNo, 0, OutputCol );
      lParse.nCols++;

      for( i=0; i<nRngs; i++ ) {
         Info.dataPtr = NULL;
         Info.maxRows = end[i]-start[i]+1;

          /*
            If there is only 1 range, and it includes all the rows,
            and there are 10 or more rows, then set nPerLp = 0 so
            that the iterator function will dynamically choose the
            most efficient number of rows to process in each loop.
            Otherwise, set nPerLp to the number of rows in this range.
         */

         if( (Info.maxRows >= 10) && (nRngs == 1) &&
             (start[0] == 1) && (end[0] == totaln))
              nPerLp = 0;
         else
              nPerLp = Info.maxRows;

         if( ffiter( lParse.nCols, lParse.colData, start[i]-1,
                     nPerLp, fits_parser_workfn, (void*)&Info, status ) == -1 )
            *status = 0;
         else if( *status ) {
            ffcprs(&lParse);
            return( *status );
         }
         if( Info.anyNull ) anyNull = 1;
      }

      if( newNullKwd && !anyNull ) {
         ffdkey( outfptr, nullKwd, status );
      }

   } else {

      /* Put constant result into keyword */

      result  = lParse.Nodes + lParse.resultNode;
      switch( Info.datatype ) {
      case TDOUBLE:
         ffukyd( outfptr, parName, result->value.data.dbl, 15,
                 parInfo, status );
         break;
      case TLONG:
         ffukyj( outfptr, parName, result->value.data.lng, parInfo, status );
         break;
      case TLOGICAL:
         ffukyl( outfptr, parName, result->value.data.log, parInfo, status );
         break;
      case TBIT:
      case TSTRING:
	 if (fits_strcasecmp(parName,"HISTORY") == 0) {
	   ffphis( outfptr, result->value.data.str, status);
	 } else if (fits_strcasecmp(parName,"COMMENT") == 0) {
	   ffpcom( outfptr, result->value.data.str, status);
	 } else {
	   ffukys( outfptr, parName, result->value.data.str, parInfo, status );
	 }
         break;
      }
   }

   ffcprs(&lParse);
   return( *status );
}